

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O0

string_view __thiscall absl::ByString::Find(ByString *this,string_view text,size_t pos)

{
  long lVar1;
  size_type sVar2;
  const_pointer pvVar3;
  size_type sVar4;
  undefined8 in_RCX;
  char *in_RDX;
  size_t in_RSI;
  string *in_RDI;
  undefined1 auVar5 [16];
  string_view sVar6;
  size_t found_pos;
  size_type in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  char __c;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  __c = (char)((ulong)in_stack_ffffffffffffffb8 >> 0x38);
  local_20._M_len = in_RSI;
  local_20._M_str = in_RDX;
  lVar1 = std::__cxx11::string::length();
  if (lVar1 == 1) {
    std::__cxx11::string::operator[]((ulong)in_RDI);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      (in_stack_ffffffffffffffc0,__c,(size_type)in_stack_ffffffffffffffb0);
    if (sVar2 == 0xffffffffffffffff) {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_20);
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_20);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_10,pvVar3 + sVar4,0);
    }
    else {
      local_10 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                            in_stack_ffffffffffffffa0);
    }
  }
  else {
    auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
    local_10 = anon_unknown_5::GenericFind<absl::(anonymous_namespace)::LiteralPolicy>
                         (local_20._M_len,local_20._M_str,auVar5._0_8_,auVar5._8_8_,in_RCX);
  }
  sVar6._M_len = local_10._M_len;
  sVar6._M_str = local_10._M_str;
  return sVar6;
}

Assistant:

absl::string_view ByString::Find(absl::string_view text, size_t pos) const {
  if (delimiter_.length() == 1) {
    // Much faster to call find on a single character than on an
    // absl::string_view.
    size_t found_pos = text.find(delimiter_[0], pos);
    if (found_pos == absl::string_view::npos)
      return absl::string_view(text.data() + text.size(), 0);
    return text.substr(found_pos, 1);
  }
  return GenericFind(text, delimiter_, pos, LiteralPolicy());
}